

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void refresh(void)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  char (*pacVar5) [8];
  int iVar6;
  bool bVar7;
  
  num_now[0] = 0;
  num_now[1] = 0;
  pacVar5 = chessboard;
  iVar3 = 0;
  iVar6 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      if (((*pacVar5)[lVar4] & 0xfeU) != 4) {
        (*pacVar5)[lVar4] = '\0';
        iVar1 = canrev((int)lVar2,(int)lVar4,chessboard,WHITE,0);
        if (0 < iVar1) {
          (*pacVar5)[lVar4] = (*pacVar5)[lVar4] + '\x01';
          iVar6 = iVar6 + 1;
          num_now[0] = iVar6;
        }
        iVar1 = canrev((int)lVar2,(int)lVar4,chessboard,BLACK,0);
        if (0 < iVar1) {
          (*pacVar5)[lVar4] = (*pacVar5)[lVar4] + '\x02';
          iVar3 = iVar3 + 1;
          num_now[1] = iVar3;
        }
      }
    }
    pacVar5 = pacVar5 + 1;
  }
  iVar3 = 8;
  iVar6 = 0;
  while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
    printf("   %c",(ulong)(iVar6 + 0x61));
    iVar6 = iVar6 + 1;
  }
  pacVar5 = chessboard;
  lVar2 = 0;
  while( true ) {
    printf("\n ");
    iVar3 = 8;
    if (lVar2 == 8) break;
    while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
      printf("+---");
    }
    printf("+\n%c",(ulong)((int)lVar2 + 0x31));
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      printf("| %c ",(ulong)(uint)(int)symbol[(*pacVar5)[lVar4]]);
    }
    putchar(0x7c);
    lVar2 = lVar2 + 1;
    pacVar5 = pacVar5 + 1;
  }
  while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
    printf("+---");
  }
  puts("+");
  return;
}

Assistant:

void refresh() {
    int i, j;
    num_now[0] = 0;
    num_now[1] = 0;
    for (i = 0; i < SIZE; i++) {
        for (j = 0; j < SIZE; j++) {
            if (chessboard[i][j] != WHITE && chessboard[i][j] != BLACK) {
                chessboard[i][j] = 0;
                if (canrev(i, j, chessboard, WHITE, 0) > 0) {
                    chessboard[i][j] += WHITE_;
                    num_now[0]++;
                }
                if (canrev(i, j, chessboard, BLACK, 0) > 0) {
                    chessboard[i][j] += BLACK_;
                    num_now[1]++;
                }
            }
        }
    }
    for (i = 0; i < SIZE; i++) {
        printf("   %c", 'a' + i);
    }
    for (i = 0; i < SIZE; i++) {
        printf("\n ");
        for (j = 0; j < SIZE; j++) {
            printf("+---");
        }
        printf("+\n%c", '1' + i);
        for (j = 0; j < SIZE; j++) {
            printf("| %c ", symbol[chessboard[i][j]]);
        }
        printf("|");
    }
    printf("\n ");
    for (i = 0; i < SIZE; i++) {
        printf("+---");
    }
    printf("+\n");
}